

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void parse(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
          cio_read_buffer *read_buffer,size_t bytes_to_parse)

{
  ulong uVar1;
  cio_error cVar2;
  size_t sVar3;
  uint8_t *data;
  
  if (err < CIO_SUCCESS) {
    handle_server_error((cio_http_client *)handler_context,"Reading from buffered stream failed!");
    return;
  }
  uVar1 = *(ulong *)((long)handler_context + 0x310);
  if (uVar1 == 0) {
    if (err == CIO_EOF) {
      bytes_to_parse = 0;
    }
    data = read_buffer->fetch_ptr;
  }
  else {
    data = read_buffer->fetch_ptr;
    bytes_to_parse = (long)read_buffer->add_ptr - (long)data;
    if (uVar1 <= bytes_to_parse) {
      bytes_to_parse = uVar1;
    }
    *(ulong *)((long)handler_context + 0x310) = uVar1 - bytes_to_parse;
  }
  *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + 1;
  sVar3 = http_parser_execute((http_parser *)((long)handler_context + 0x358),
                              (http_parser_settings *)((long)handler_context + 0x378),(char *)data,
                              bytes_to_parse);
  read_buffer->fetch_ptr = read_buffer->fetch_ptr + sVar3;
  *(int *)((long)handler_context + 0x31c) = *(int *)((long)handler_context + 0x31c) + -1;
  if (err != CIO_EOF) {
    if (sVar3 == bytes_to_parse) {
      if (*(char *)((long)handler_context + 0x31b) != '\x01') {
        if (*(int *)((long)handler_context + 0x36c) < 0) {
          return;
        }
        (**(code **)((long)handler_context + 0x328))();
        return;
      }
    }
    else {
      cVar2 = write_response((cio_http_client *)handler_context,CIO_HTTP_STATUS_BAD_REQUEST,
                             (cio_write_buffer *)0x0,(cio_response_written_cb_t)0x0);
      if (cVar2 == CIO_SUCCESS) {
        return;
      }
    }
  }
  close_client((cio_http_client *)handler_context);
  return;
}

Assistant:

static void parse(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t bytes_to_parse)
{
	(void)buffered_stream;

	struct cio_http_client *client = (struct cio_http_client *)handler_context;
	http_parser *parser = &client->parser;

	if (cio_unlikely(cio_is_error(err))) {
		handle_server_error(client, "Reading from buffered stream failed!");
		return;
	}

	if (err == CIO_EOF) {
		bytes_to_parse = 0;
	}

	if (client->http_private.remaining_content_length > 0) {
		size_t available = cio_read_buffer_unread_bytes(read_buffer);
		bytes_to_parse = CIO_MIN(available, client->http_private.remaining_content_length);
		client->http_private.remaining_content_length -= bytes_to_parse;
	}

	client->http_private.parsing++;

	size_t nparsed = http_parser_execute(parser, &client->parser_settings, (const char *)cio_read_buffer_get_read_ptr(read_buffer), bytes_to_parse);
	cio_read_buffer_consume(read_buffer, nparsed);
	client->http_private.parsing--;

	if (err == CIO_EOF) {
		close_client(client);
		return;
	}

	if (cio_unlikely(nparsed != bytes_to_parse)) {
		err = write_response(client, CIO_HTTP_STATUS_BAD_REQUEST, NULL, NULL);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			close_client(client);
		}

		return;
	}

	if (client->http_private.to_be_closed) {
		close_client(client);
		return;
	}

	if (parser->upgrade) {
		return;
	}

	client->http_private.finish_func(client);
}